

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O1

double __thiscall S1Interval::Project(S1Interval *this,double p)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  S2LogMessage SStack_18;
  
  dVar1 = (this->bounds_).c_[0];
  if ((((dVar1 == 3.141592653589793) && (!NAN(dVar1))) &&
      (dVar1 = (this->bounds_).c_[1], dVar1 == -3.141592653589793)) && (!NAN(dVar1))) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
               ,0xba,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: !is_empty() ",0x1a);
LAB_0019e5ec:
    abort();
  }
  if (3.141592653589793 < ABS(p)) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
               ,0xbb,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: (fabs(p)) <= (3.14159265358979323846) ",0x34);
    goto LAB_0019e5ec;
  }
  dVar6 = (double)(~-(ulong)(p == -3.141592653589793) & (ulong)p |
                  -(ulong)(p == -3.141592653589793) & 0x400921fb54442d18);
  dVar1 = (this->bounds_).c_[0];
  dVar2 = (this->bounds_).c_[1];
  if (dVar1 <= dVar2) {
    if (dVar6 < dVar1) goto LAB_0019e4f7;
    bVar3 = dVar6 <= dVar2;
  }
  else {
    if ((dVar6 < dVar1) && (dVar2 < dVar6)) goto LAB_0019e4f7;
    bVar3 = dVar1 != 3.141592653589793 || dVar2 != -3.141592653589793;
  }
  if (bVar3) {
    return dVar6;
  }
LAB_0019e4f7:
  uVar4 = -(ulong)(dVar1 - dVar6 < 0.0);
  uVar5 = -(ulong)(dVar6 - dVar2 < 0.0);
  uVar4 = -(ulong)((double)(~uVar4 & (ulong)(dVar1 - dVar6) |
                           (ulong)((dVar1 + 3.141592653589793) - (dVar6 + -3.141592653589793)) &
                           uVar4) <
                  (double)(~uVar5 & (ulong)(dVar6 - dVar2) |
                          (ulong)((dVar6 + 3.141592653589793) - (dVar2 + -3.141592653589793)) &
                          uVar5));
  return (double)(~uVar4 & (ulong)dVar2 | (ulong)dVar1 & uVar4);
}

Assistant:

double S1Interval::Project(double p) const {
  S2_DCHECK(!is_empty());
  S2_DCHECK_LE(fabs(p), M_PI);
  if (p == -M_PI) p = M_PI;
  if (FastContains(p)) return p;
  // Compute distance from p to each endpoint.
  double dlo = PositiveDistance(p, lo());
  double dhi = PositiveDistance(hi(), p);
  return (dlo < dhi) ? lo() : hi();
}